

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::StreamingListener
          (StreamingListener *this,string *host,string *port)

{
  SocketWriter *this_00;
  
  (this->super_EmptyTestEventListener).super_TestEventListener._vptr_TestEventListener =
       (_func_int **)&PTR__StreamingListener_001458e8;
  this_00 = (SocketWriter *)operator_new(0x50);
  SocketWriter::SocketWriter(this_00,host,port);
  (this->socket_writer_)._M_t.
  super___uniq_ptr_impl<testing::internal::StreamingListener::AbstractSocketWriter,_std::default_delete<testing::internal::StreamingListener::AbstractSocketWriter>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::StreamingListener::AbstractSocketWriter_*,_std::default_delete<testing::internal::StreamingListener::AbstractSocketWriter>_>
  .super__Head_base<0UL,_testing::internal::StreamingListener::AbstractSocketWriter_*,_false>.
  _M_head_impl = (AbstractSocketWriter *)this_00;
  Start(this);
  return;
}

Assistant:

StreamingListener(const std::string& host, const std::string& port)
      : socket_writer_(new SocketWriter(host, port)) {
    Start();
  }